

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ReadObjectTag(BCReaderState *s)

{
  JSValue val_00;
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  JSValueUnion *in_RDI;
  JSValue JVar3;
  int unaff_retaddr;
  int ret;
  JSValue val;
  JSAtom atom;
  uint32_t i;
  uint32_t prop_count;
  JSValue obj;
  JSContext *ctx;
  BCReaderState *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffff78;
  JSAtom in_stack_ffffffffffffff7c;
  JSContext *in_stack_ffffffffffffff80;
  JSValue in_stack_ffffffffffffff88;
  JSValueUnion local_68;
  int64_t local_60;
  JSAtom in_stack_ffffffffffffffc4;
  uint uVar4;
  uint in_stack_ffffffffffffffcc;
  JSValueUnion JVar5;
  int32_t local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  JVar5 = *in_RDI;
  JVar3 = JS_NewObject((JSContext *)0x16d223);
  local_68 = JVar3.u;
  local_60 = JVar3.tag;
  JVar3.u._4_4_ = in_stack_ffffffffffffff7c;
  JVar3.u.int32 = in_stack_ffffffffffffff78;
  JVar3.tag = (int64_t)in_stack_ffffffffffffff80;
  iVar2 = BC_add_object_ref((BCReaderState *)0x16d255,JVar3);
  if ((iVar2 == 0) &&
     (iVar2 = bc_get_leb128((BCReaderState *)in_stack_ffffffffffffff88.u.ptr,
                            (uint32_t *)in_stack_ffffffffffffff80), iVar2 == 0)) {
    for (uVar4 = 0; uVar4 < in_stack_ffffffffffffffcc; uVar4 = uVar4 + 1) {
      iVar2 = bc_get_atom((BCReaderState *)in_stack_ffffffffffffff88.u.ptr,
                          (JSAtom *)in_stack_ffffffffffffff80);
      if (iVar2 != 0) goto LAB_0016d362;
      in_stack_ffffffffffffff88 = JS_ReadObjectRec(in_stack_000000d0);
      iVar2 = JS_IsException(in_stack_ffffffffffffff88);
      if (iVar2 != 0) {
        JS_FreeAtom(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        goto LAB_0016d362;
      }
      this_obj.tag = (int64_t)in_RDI;
      this_obj.u.float64 = JVar5.float64;
      val_00.tag = local_60;
      val_00.u.float64 = local_68.float64;
      iVar2 = JS_DefinePropertyValue
                        ((JSContext *)CONCAT44(in_stack_ffffffffffffffcc,uVar4),this_obj,
                         in_stack_ffffffffffffffc4,val_00,unaff_retaddr);
      JS_FreeAtom(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      if (iVar2 < 0) goto LAB_0016d362;
    }
    local_10 = local_68.int32;
    uStack_c = local_68._4_4_;
    local_8 = local_60;
  }
  else {
LAB_0016d362:
    JS_FreeValue(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
    local_10 = 0;
    local_8 = 6;
  }
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue JS_ReadObjectTag(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue obj;
    uint32_t prop_count, i;
    JSAtom atom;
    JSValue val;
    int ret;
    
    obj = JS_NewObject(ctx);
    if (BC_add_object_ref(s, obj))
        goto fail;
    if (bc_get_leb128(s, &prop_count))
        goto fail;
    for(i = 0; i < prop_count; i++) {
        if (bc_get_atom(s, &atom))
            goto fail;
#ifdef DUMP_READ_OBJECT
        bc_read_trace(s, "propname: "); print_atom(s->ctx, atom); printf("\n");
#endif
        val = JS_ReadObjectRec(s);
        if (JS_IsException(val)) {
            JS_FreeAtom(ctx, atom);
            goto fail;
        }
        ret = JS_DefinePropertyValue(ctx, obj, atom, val, JS_PROP_C_W_E);
        JS_FreeAtom(ctx, atom);
        if (ret < 0)
            goto fail;
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}